

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

void mzd_addmul_v_s128_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  uint w;
  int iVar1;
  block_t *Ablock;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar5 = ZEXT1664(*(undefined1 (*) [16])c->w64);
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  iVar1 = 2;
  do {
    lVar2 = 0;
    do {
      auVar3 = vpbroadcastq_avx512vl();
      auVar4 = vpbroadcastq_avx512vl();
      auVar7 = vpsllq_avx(auVar4,0x3e);
      auVar7 = vpsraq_avx512vl(auVar7,0x3f);
      auVar8 = vpsllq_avx(auVar4,0x3d);
      auVar8 = vpsraq_avx512vl(auVar8,0x3f);
      auVar3 = vpternlogq_avx512vl(auVar5._0_16_,auVar3,*(undefined1 (*) [16])((long)A->w64 + lVar2)
                                   ,0x78);
      auVar3 = vpternlogq_avx512vl(auVar3,auVar8,*(undefined1 (*) [16])((long)A[1].w64 + lVar2),0x78
                                  );
      auVar5 = ZEXT1664(auVar3);
      auVar4 = vpsllq_avx(auVar4,0x3c);
      auVar4 = vpsraq_avx512vl(auVar4,0x3f);
      auVar7 = vpternlogq_avx512vl(auVar6._0_16_,auVar7,
                                   *(undefined1 (*) [16])((long)A->w64 + lVar2 + 0x10),0x78);
      auVar4 = vpternlogq_avx512vl(auVar7,auVar4,
                                   *(undefined1 (*) [16])((long)A[1].w64 + lVar2 + 0x10),0x78);
      auVar6 = ZEXT1664(auVar4);
      lVar2 = lVar2 + 0x40;
    } while ((int)lVar2 != 0x400);
    A = A + 0x20;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  *(undefined1 (*) [16])c->w64 = auVar3 ^ auVar4;
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_addmul_v_s128_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[4] = {mm128_load(cblock->w64), mm128_zero, mm128_zero, mm128_zero};
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 4, idx >>= 4, Ablock += 2) {
      cval[0] = mm128_xor_mask(cval[0], mm128_load(&Ablock[0].w64[0]), mm128_compute_mask(idx, 0));
      cval[1] = mm128_xor_mask(cval[1], mm128_load(&Ablock[0].w64[2]), mm128_compute_mask(idx, 1));
      cval[0] = mm128_xor_mask(cval[0], mm128_load(&Ablock[1].w64[0]), mm128_compute_mask(idx, 2));
      cval[1] = mm128_xor_mask(cval[1], mm128_load(&Ablock[1].w64[2]), mm128_compute_mask(idx, 3));
    }
  }
  mm128_store(cblock->w64, mm128_xor(cval[0], cval[1]));
}